

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::setStatusTip(QAction *this,QString *statustip)

{
  QActionPrivate *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  lVar1 = (this_00->statustip).d.size;
  lVar2 = (statustip->d).size;
  if (lVar1 == lVar2) {
    QVar4.m_data = (this_00->statustip).d.ptr;
    QVar4.m_size = lVar1;
    QVar5.m_data = (statustip->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->statustip,statustip);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setStatusTip(const QString &statustip)
{
    Q_D(QAction);
    if (d->statustip == statustip)
        return;

    d->statustip = statustip;
    d->sendDataChanged();
}